

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

CryptoUtil * __thiscall
cfd::core::CryptoUtil::DecryptAes256ToString_abi_cxx11_
          (CryptoUtil *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
          ByteData *data)

{
  int iVar1;
  size_type sVar2;
  CfdException *pCVar3;
  size_t sVar4;
  uchar *puVar5;
  uchar *bytes;
  uchar *bytes_out;
  size_type len;
  allocator local_e1;
  string local_e0;
  CfdSourceLocation local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  int local_90;
  allocator<unsigned_char> local_89;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  allocator local_59;
  string local_58;
  CfdSourceLocation local_38;
  ByteData *local_20;
  ByteData *data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_local;
  string *ret_str;
  
  local_20 = data;
  data_local = (ByteData *)key;
  key_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)key);
  if (sVar2 != 0x20) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x267;
    local_38.funcname = "DecryptAes256ToString";
    logger::warn<>(&local_38,"wally_aes key size NG.");
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_58,"DecryptAes256 key size error.",&local_59);
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,&local_58);
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar4 = ByteData::GetDataSize(local_20);
  ::std::allocator<unsigned_char>::allocator(&local_89);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,sVar4,&local_89);
  ::std::allocator<unsigned_char>::~allocator(&local_89);
  puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)data_local);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)data_local);
  ByteData::GetBytes(&local_a8,local_20);
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  sVar4 = ByteData::GetDataSize(local_20);
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  iVar1 = wally_aes(puVar5,sVar2,bytes,sVar4,2,bytes_out,len);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  local_90 = iVar1;
  if (iVar1 == 0) {
    ::std::__cxx11::string::string((string *)this);
    puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    ::std::__cxx11::string::append((char *)this,(ulong)puVar5);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    return this;
  }
  local_c0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
               ,0x2f);
  local_c0.filename = local_c0.filename + 1;
  local_c0.line = 0x272;
  local_c0.funcname = "DecryptAes256ToString";
  logger::warn<int&>(&local_c0,"wally_aes NG[{}].",&local_90);
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_e0,"DecryptAes256 error.",&local_e1);
  CfdException::CfdException(pCVar3,kCfdIllegalStateError,&local_e0);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string CryptoUtil::DecryptAes256ToString(
    const std::vector<uint8_t> &key, const ByteData &data) {
  if (key.size() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(kCfdIllegalStateError, "DecryptAes256 key size error.");
  }

  std::vector<uint8_t> output(data.GetDataSize());

  // Decrypt data using AES (ECB mode, no padding).
  int ret = wally_aes(
      key.data(), key.size(), data.GetBytes().data(), data.GetDataSize(),
      AES_FLAG_DECRYPT, output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "DecryptAes256 error.");
  }

  std::string ret_str;
  ret_str.append(reinterpret_cast<const char *>(output.data()), output.size());
  return ret_str;
}